

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

int uv_thread_getcpu(void)

{
  int *piVar1;
  int local_c;
  int cpu;
  
  local_c = sched_getcpu();
  if (local_c < 0) {
    piVar1 = __errno_location();
    local_c = -*piVar1;
  }
  return local_c;
}

Assistant:

int uv_thread_getcpu(void) {
#if UV__CPU_AFFINITY_SUPPORTED
  int cpu;

  cpu = sched_getcpu();
  if (cpu < 0)
    return UV__ERR(errno);

  return cpu;
#else
  return UV_ENOTSUP;
#endif
}